

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O0

void __thiscall
chrono::curiosity::CuriosityPart::CalcMassProperties(CuriosityPart *this,double density)

{
  element_type *peVar1;
  ChVector<double> *other;
  ChMatrix33<double> *pCVar2;
  ChFrame<double> local_230;
  undefined1 local_1a8 [8];
  ChMatrix33<double> inertia;
  ChMatrix33<double> cog_rot;
  ChVector<double> cog_pos;
  double vol;
  ChVector<double> local_b0;
  undefined1 local_98 [8];
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh_col;
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  string local_38 [8];
  string mesh_filename;
  double density_local;
  CuriosityPart *this_local;
  
  std::operator+((char *)local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "robot/curiosity/col/");
  std::operator+(local_58,(char *)local_78);
  chrono::GetChronoDataFile(local_38);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string(local_78);
  chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((string *)local_98,SUB81(local_38,0),false);
  peVar1 = std::
           __shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_98);
  other = ChFrame<double>::GetPos(&this->m_mesh_xform);
  ChVector<double>::ChVector(&local_b0,other);
  pCVar2 = ChFrame<double>::GetA(&this->m_mesh_xform);
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)&vol,pCVar2);
  (**(code **)(*(long *)peVar1 + 0x80))(peVar1,&local_b0,&vol);
  std::
  __shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_98);
  chrono::geometry::ChTriangleMeshConnected::RepairDuplicateVertexes(1e-09);
  ChVector<double>::ChVector
            ((ChVector<double> *)
             (cog_rot.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
             8));
  ChMatrix33<double>::ChMatrix33
            ((ChMatrix33<double> *)
             (inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
             8));
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_1a8);
  peVar1 = std::
           __shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_98);
  chrono::geometry::ChTriangleMeshConnected::ComputeMassProperties
            (SUB81(peVar1,0),(double *)0x1,(ChVector *)(cog_pos.m_data + 2),
             (ChMatrix33 *)
             (cog_rot.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
             8));
  ChInertiaUtils::PrincipalInertia
            ((ChMatrix33<double> *)local_1a8,&this->m_inertia,
             (ChMatrix33<double> *)
             (inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
             8));
  this->m_mass = density * cog_pos.m_data[2];
  ChVector<double>::operator*=(&this->m_inertia,density);
  ChFrame<double>::ChFrame
            (&local_230,
             (ChVector<double> *)
             (cog_rot.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
             8),(ChMatrix33<double> *)
                (inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                + 8));
  ChFrame<double>::operator=(&this->m_cog,&local_230);
  ChFrame<double>::~ChFrame(&local_230);
  std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>::~shared_ptr
            ((shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)local_98);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void CuriosityPart::CalcMassProperties(double density) {
    auto mesh_filename = GetChronoDataFile("robot/curiosity/col/" + m_mesh_name + ".obj");
    auto trimesh_col = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(mesh_filename, false, false);
    trimesh_col->Transform(m_mesh_xform.GetPos(), m_mesh_xform.GetA());  // translate/rotate/scale mesh
    trimesh_col->RepairDuplicateVertexes(1e-9);                          // if meshes are not watertight

    double vol;
    ChVector<> cog_pos;
    ChMatrix33<> cog_rot;
    ChMatrix33<> inertia;
    trimesh_col->ComputeMassProperties(true, vol, cog_pos, inertia);
    ChInertiaUtils::PrincipalInertia(inertia, m_inertia, cog_rot);
    m_mass = density * vol;
    m_inertia *= density;
    m_cog = ChFrame<>(cog_pos, cog_rot);
}